

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol_reader.cpp
# Opt level: O2

void __thiscall HawkTracer::parser::ProtocolReader::stop(ProtocolReader *this)

{
  LOCK();
  (this->_is_running)._M_base._M_i = false;
  UNLOCK();
  if ((this->_thread)._M_id._M_thread != 0) {
    std::thread::join();
  }
  (*((this->_stream)._M_t.
     super___uniq_ptr_impl<HawkTracer::parser::Stream,_std::default_delete<HawkTracer::parser::Stream>_>
     ._M_t.
     super__Tuple_impl<0UL,_HawkTracer::parser::Stream_*,_std::default_delete<HawkTracer::parser::Stream>_>
     .super__Head_base<0UL,_HawkTracer::parser::Stream_*,_false>._M_head_impl)->_vptr_Stream[5])();
  return;
}

Assistant:

void ProtocolReader::stop()
{
    _is_running = false;
    if (_thread.joinable())
    {
        _thread.join();
    }
    _stream->stop();
}